

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O2

void __thiscall
diy::Master::Proxy::Proxy(Proxy *this,Master *master__,int gid__,IExchangeInfo *iexchange__)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>
  _Var2;
  CollectivesList *pCVar3;
  OutgoingQueues *this_00;
  undefined8 extraout_RDX;
  _Elt_pointer pQVar4;
  undefined1 auVar5 [16];
  iterator __begin3;
  accessor access;
  iterator __end3;
  iterator local_78;
  deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *local_60;
  unique_lock<tthread::fast_mutex> local_58;
  iterator local_48;
  
  this->gid_ = gid__;
  this->master_ = master__;
  this->iexchange_ = iexchange__;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->incoming_)._M_t._M_impl.super__Rb_tree_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->outgoing_)._M_t._M_impl.super__Rb_tree_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar3 = collectives(master__,gid__);
  this->collectives_ = pCVar3;
  this->done_ = false;
  fill_incoming(this);
  if (this->iexchange_ == (IExchangeInfo *)0x0) {
    this_00 = outgoing(this->master_,this->gid_);
    concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
    ::begin(&local_78,this_00);
    concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
    ::end(&local_48,this_00);
    auVar5._8_8_ = extraout_RDX;
    auVar5._0_8_ = local_78.it._M_node;
    while (local_78.it._M_node = auVar5._0_8_, _Var2._M_node = local_78.it._M_node,
          local_78.it._M_node != local_48.it._M_node) {
      critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
      ::access((critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                *)&local_60,(char *)&local_78.it._M_node[1]._M_parent,auVar5._8_4_);
      pQVar4 = (local_60->
               super__Deque_base<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>
               )._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pQVar4 != (local_60->
                    super__Deque_base<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>
                    )._M_impl.super__Deque_impl_data._M_start._M_cur) {
        if (pQVar4 == (local_60->
                      super__Deque_base<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>
                      )._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pQVar4 = (local_60->
                   super__Deque_base<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>
                   )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
        }
        std::
        _Rb_tree<diy::BlockID,std::pair<diy::BlockID_const,diy::MemoryBuffer>,std::_Select1st<std::pair<diy::BlockID_const,diy::MemoryBuffer>>,std::less<diy::BlockID>,std::allocator<std::pair<diy::BlockID_const,diy::MemoryBuffer>>>
        ::_M_emplace_unique<diy::BlockID_const&,diy::MemoryBuffer>
                  ((_Rb_tree<diy::BlockID,std::pair<diy::BlockID_const,diy::MemoryBuffer>,std::_Select1st<std::pair<diy::BlockID_const,diy::MemoryBuffer>>,std::less<diy::BlockID>,std::allocator<std::pair<diy::BlockID_const,diy::MemoryBuffer>>>
                    *)&this->outgoing_,(BlockID *)(_Var2._M_node + 1),&pQVar4[-1].buffer_);
        std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::pop_back
                  (local_60);
      }
      std::unique_lock<tthread::fast_mutex>::~unique_lock(&local_58);
      auVar5 = std::_Rb_tree_increment(local_78.it._M_node);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.lock_ptr.
                super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.lock_ptr.
                super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

Proxy(Master* master__, int gid__,
                              IExchangeInfo*  iexchange__ = 0):
                          gid_(gid__),
                          master_(master__),
                          iexchange_(iexchange__),
                          collectives_(&master__->collectives(gid__))
    {
        fill_incoming();

        // move outgoing_ back into proxy, in case it's a multi-foreach round
        if (!iexchange_)
            for (auto& x : master_->outgoing(gid_))
            {
                auto access = x.second.access();
                if (!access->empty())
                {
                    outgoing_.emplace(x.first, access->back().move());
                    access->pop_back();
                }
            }
    }